

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O1

void __thiscall
FIX::MessageCracker::crack
          (MessageCracker *this,Message *message,SessionID *sessionID,ApplVerID *applVerID)

{
  int iVar1;
  string *psVar2;
  
  psVar2 = &(applVerID->super_StringField).super_FieldBase.m_string;
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar1 == 0) {
    FIX40::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar1 == 0) {
    FIX41::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar1 == 0) {
    FIX42::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar1 == 0) {
    FIX43::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar1 == 0) {
    FIX44::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar1 == 0) {
    FIX50::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar1 == 0) {
    FIX50SP1::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar1 != 0) {
    return;
  }
  FIX50SP2::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  return;
}

Assistant:

void crack(const Message &message, const SessionID &sessionID, const ApplVerID &applVerID) {
    if (applVerID == ApplVerID_FIX40) {
      ((FIX40::MessageCracker &)(*this)).crack((const FIX40::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX41) {
      ((FIX41::MessageCracker &)(*this)).crack((const FIX41::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX42) {
      ((FIX42::MessageCracker &)(*this)).crack((const FIX42::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX43) {
      ((FIX43::MessageCracker &)(*this)).crack((const FIX43::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX44) {
      ((FIX44::MessageCracker &)(*this)).crack((const FIX44::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX50) {
      ((FIX50::MessageCracker &)(*this)).crack((const FIX50::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX50_SP1) {
      ((FIX50SP1::MessageCracker &)(*this)).crack((const FIX50SP1::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX50_SP2) {
      ((FIX50SP2::MessageCracker &)(*this)).crack((const FIX50SP2::Message &)message, sessionID);
    }
  }